

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall
Js::ByteCodeWriter::Reg2B1(ByteCodeWriter *this,OpCode op,RegSlot R0,RegSlot R1,uint8 B2)

{
  code *pcVar1;
  uint8 B2_00;
  bool bVar2;
  RegSlot R0_00;
  RegSlot R1_00;
  undefined4 *puVar3;
  FunctionBody *pFVar4;
  undefined7 in_register_00000081;
  RegSlot local_3d;
  RegSlot local_39;
  undefined1 local_35;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000081,B2);
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0xd);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x255,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_0088dc75;
    *puVar3 = 0;
  }
  if (R0 != 0xffffffff) {
    pFVar4 = this->m_functionWrite;
    if (pFVar4 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar2) goto LAB_0088dc75;
      *puVar3 = 0;
      pFVar4 = this->m_functionWrite;
    }
    R0_00 = FunctionBody::MapRegSlot(pFVar4,R0);
    if (R1 != 0xffffffff) {
      pFVar4 = this->m_functionWrite;
      if (pFVar4 != (FunctionBody *)0x0) {
LAB_0088db9a:
        R1_00 = FunctionBody::MapRegSlot(pFVar4,R1);
        B2_00 = (uint8)local_34;
        bVar2 = TryWriteReg2B1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                          (this,op,R0_00,R1_00,(uint8)local_34);
        if (!bVar2) {
          bVar2 = TryWriteReg2B1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>(this,op,R0_00,R1_00,B2_00)
          ;
          if (!bVar2) {
            local_35 = (undefined1)local_34;
            local_3d = R0_00;
            local_39 = R1_00;
            Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,op,this);
            Data::Write(&this->m_byteCodeData,&local_3d,9);
          }
        }
        return;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (bVar2) {
        *puVar3 = 0;
        pFVar4 = this->m_functionWrite;
        goto LAB_0088db9a;
      }
      goto LAB_0088dc75;
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar2) {
    *puVar3 = 0;
    Throw::InternalError();
  }
LAB_0088dc75:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeWriter::Reg2B1(OpCode op, RegSlot R0, RegSlot R1, uint8 B2)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::Reg2B1);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        R0 = ConsumeReg(R0);
        R1 = ConsumeReg(R1);

        MULTISIZE_LAYOUT_WRITE(Reg2B1, op, R0, R1, B2);
    }